

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

void Abc_BufCollectTfoCone_rec(Abc_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  uint uVar5;
  uint uVar6;
  int in_EDX;
  int Fill;
  long lVar7;
  
  pAVar3 = pNode->pNtk;
  iVar1 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,in_EDX);
  if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNode->pNtk;
  iVar2 = pAVar4->nTravIds;
  if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
    if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar1] = iVar2;
    uVar5 = *(uint *)&pNode->field_0x14;
    uVar6 = uVar5 & 0xf;
    if (uVar6 - 5 < 0xfffffffe) {
      if ((7 < uVar6) || ((0xa4U >> uVar6 & 1) == 0)) {
        __assert_fail("Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclBuffer.c"
                      ,0x24d,"void Abc_BufCollectTfoCone_rec(Abc_Obj_t *, Vec_Int_t *)");
      }
      if (0 < (pNode->vFanouts).nSize) {
        lVar7 = 0;
        do {
          Abc_BufCollectTfoCone_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar7]],vNodes
                    );
          lVar7 = lVar7 + 1;
        } while (lVar7 < (pNode->vFanouts).nSize);
        uVar5 = *(uint *)&pNode->field_0x14;
      }
      if ((uVar5 & 0xf) == 7) {
        Vec_IntPush(vNodes,pNode->Id);
        return;
      }
    }
  }
  return;
}

Assistant:

void Abc_BufCollectTfoCone_rec( Abc_Obj_t * pNode, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsCi(pNode) || Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanout( pNode, pNext, i )
        Abc_BufCollectTfoCone_rec( pNext, vNodes );
    if ( Abc_ObjIsNode(pNode) )
        Vec_IntPush( vNodes, Abc_ObjId(pNode) );
}